

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_esis.c
# Opt level: O3

int parse_esis(int *arr_sz,int *reserved_sz,uint32_t **esi_arr,char *p)

{
  char *in_RAX;
  long lVar1;
  long lVar2;
  ushort **ppuVar3;
  ulong uVar4;
  char cVar5;
  char *pcVar6;
  char *endptr;
  char *local_38;
  
  local_38 = in_RAX;
  lVar1 = strtol(p,&local_38,0);
  if (local_38 != p) {
    do {
      pcVar6 = local_38;
      if (*local_38 == '-') {
        lVar2 = strtol(local_38 + 1,&local_38,0);
        pcVar6 = local_38;
        if (lVar1 <= lVar2) {
          do {
            append(arr_sz,reserved_sz,esi_arr,(uint32_t)lVar1);
            lVar1 = lVar1 + 1;
          } while (lVar2 + 1 != lVar1);
        }
      }
      else {
        append(arr_sz,reserved_sz,esi_arr,(uint32_t)lVar1);
      }
      cVar5 = *pcVar6;
      if (cVar5 == '\0') {
        uVar4 = 0;
      }
      else {
        ppuVar3 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar3 + (long)cVar5 * 2 + 1) & 0x20) == 0) goto LAB_001015db;
          cVar5 = pcVar6[1];
          pcVar6 = pcVar6 + 1;
        } while (cVar5 != '\0');
        cVar5 = '\0';
LAB_001015db:
        uVar4 = (ulong)(cVar5 == ',');
      }
      lVar1 = strtol(pcVar6 + uVar4,&local_38,0);
    } while (local_38 != pcVar6 + uVar4);
  }
  return 0;
}

Assistant:

int parse_esis(int* arr_sz,
		int* reserved_sz,
		uint32_t** esi_arr,
		const char* p)
{
	do {
		char* endptr;
		long int v = strtol(p, &endptr, 0);
		if (endptr == p)
			break;
		p = endptr;
		if (*p == '-') {
			/* A range was given, find the end value and
			 * place the entire range in the array.
			 */
			long int ve = strtol(p + 1, &endptr, 0);
			p = endptr;
			while (v <= ve) {
				append(arr_sz, reserved_sz, esi_arr, v);
				++v;
			}
		} else {
			append(arr_sz, reserved_sz, esi_arr, v);
		}
		while (*p != '\0' && isspace(*p))
			++p;
		if (*p == ',')
			++p;
	} while(1);

	return 0;
}